

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::argument_decl_abi_cxx11_(CompilerMSL *this,Parameter *arg)

{
  BuiltIn id;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  size_type sVar5;
  ulong uVar6;
  char *pcVar7;
  size_type sVar8;
  SPIRVariable *in_RDX;
  BuiltIn builtin_00;
  bool local_5e4;
  byte local_5e3;
  bool local_5e2;
  bool local_5e1;
  undefined1 local_5c8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588 [32];
  string local_568 [32];
  string local_548 [36];
  uint32_t local_524;
  SPIRVariable *local_520;
  SPIRVariable *backing_var;
  spirv_cross local_4f8 [32];
  undefined1 local_4d8 [64];
  __node_base_ptr local_498;
  char *img_address_space;
  undefined1 local_470 [64];
  spirv_cross local_430 [36];
  uint32_t local_40c;
  undefined1 local_408 [40];
  char *restrict_kw_1;
  string array_size_decl;
  spirv_cross local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [44];
  uint32_t array_size;
  char *argument_buffer_space;
  undefined1 local_330 [64];
  string local_2f0 [32];
  undefined1 local_2d0 [40];
  char *restrict_kw;
  string local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [32];
  spirv_cross local_240 [32];
  spirv_cross local_220 [32];
  string local_200 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0 [32];
  spirv_cross local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [32];
  spirv_cross local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  spirv_cross local_140 [32];
  undefined1 local_120 [68];
  StorageClass local_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [4];
  StorageClass storage;
  spirv_cross local_b8 [32];
  uint32_t local_98;
  BuiltIn local_94;
  uint32_t local_90;
  BuiltIn builtin_type;
  undefined1 local_88 [7];
  bool builtin;
  string address_space;
  key_type local_65 [19];
  bool local_52;
  byte local_51;
  bool is_dynamic_img_sampler;
  __node_base _Stack_50;
  char *cv_qualifier;
  bool type_is_image;
  bool constref;
  uint32_t name_id;
  bool is_pointer;
  SPIRType *pSStack_38;
  StorageClass type_storage;
  SPIRType *var_type;
  SPIRType *type;
  SPIRVariable *var;
  Parameter *arg_local;
  CompilerMSL *this_local;
  string *decl;
  
  var = in_RDX;
  arg_local = arg;
  this_local = this;
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&(in_RDX->super_IVariant)._vptr_IVariant + 4));
  type = (SPIRType *)Compiler::get<spirv_cross::SPIRVariable>((Compiler *)arg,uVar2);
  var_type = Compiler::get_variable_data_type((Compiler *)arg,(SPIRVariable *)type);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)var);
  pSStack_38 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar2);
  name_id = pSStack_38->storage;
  constref = (bool)(pSStack_38->pointer & 1);
  cv_qualifier._4_4_ =
       TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  if (((var->storage & StorageClassInput) != StorageClassUniformConstant) &&
     (uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->field_0x1c), uVar2 != 0)) {
    cv_qualifier._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->field_0x1c);
  }
  local_5e1 = false;
  if (((var->storage & StorageClassInput) == StorageClassUniformConstant) &&
     (local_5e1 = false, (constref & 1U) != 0)) {
    local_5e1 = *(int *)&(var->super_IVariant).field_0xc == 0;
  }
  cv_qualifier._3_1_ = local_5e1;
  bVar1 = type_is_msl_framebuffer_fetch((CompilerMSL *)arg,var_type);
  if (bVar1) {
    cv_qualifier._3_1_ = 0;
  }
  else if (name_id == 0) {
    cv_qualifier._3_1_ = 1;
  }
  local_5e2 = true;
  if ((*(int *)&(var_type->super_IVariant).field_0xc != 0x10) &&
     (local_5e2 = true, *(int *)&(var_type->super_IVariant).field_0xc != 0x11)) {
    local_5e2 = *(int *)&(var_type->super_IVariant).field_0xc == 0x12;
  }
  cv_qualifier._2_1_ = local_5e2;
  local_5e3 = 0;
  if ((cv_qualifier._3_1_ & 1) != 0) {
    local_5e3 = local_5e2 ^ 0xff;
  }
  _Stack_50._M_nxt = (_Hash_node_base *)0x5ab0aa;
  if ((local_5e3 & 1) != 0) {
    _Stack_50._M_nxt = (_Hash_node_base *)0x5bf82d;
  }
  local_51 = '\0';
  ::std::__cxx11::string::string((string *)this);
  local_5e4 = false;
  if ((((var->storage & StorageClassInput) == StorageClassUniformConstant) &&
      (local_5e4 = false, *(int *)&(var_type->super_IVariant).field_0xc == 0x11)) &&
     (local_5e4 = false, (var_type->image).dim == Dim2D)) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_type->image);
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar2);
    bVar1 = type_is_floating_point(pSVar4);
    local_5e4 = false;
    if (bVar1) {
      local_65[0] = SPVFuncImplDynamicImageSampler;
      sVar5 = ::std::
              set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
              ::count((set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
                       *)&arg[0x1f7].id,local_65);
      local_5e4 = sVar5 != 0;
    }
  }
  local_52 = local_5e4;
  get_argument_address_space_abi_cxx11_((CompilerMSL *)local_88,(SPIRVariable *)arg);
  local_90 = (type->super_IVariant).self.id;
  builtin_type._3_1_ = Compiler::has_decoration((Compiler *)arg,(ID)local_90,DecorationBuiltIn);
  local_98 = *(uint32_t *)((long)&(var->super_IVariant)._vptr_IVariant + 4);
  local_94 = Compiler::get_decoration((Compiler *)arg,(ID)local_98,DecorationBuiltIn);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,"threadgroup");
  if (bVar1) {
    *(undefined1 *)((long)&arg[0x229].id.id + 2) = 1;
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->field_0x1c);
  builtin_00 = (BuiltIn)arg;
  if (uVar2 == 0) {
LAB_004a247b:
    if ((builtin_type._3_1_ & 1) == BuiltInPosition >> 0x18) {
      if (((name_id == 2) || (name_id == 0xc)) &&
         (bVar1 = Compiler::is_array((Compiler *)arg,var_type), pSVar4 = var_type, bVar1)) {
        *(undefined1 *)((long)&arg[0x229].id.id + 2) = 1;
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
        (**(code **)(*(long *)arg + 0x98))(local_1a0,arg,pSVar4,uVar2);
        join<char_const*&,std::__cxx11::string,char_const(&)[2]>
                  (local_180,(char **)&stack0xffffffffffffffb0,local_1a0,(char (*) [2])0x5badb7);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_180);
        ::std::__cxx11::string::~string((string *)local_180);
        ::std::__cxx11::string::~string((string *)local_1a0);
      }
      else if ((local_52 & 1U) == 0) {
        bVar1 = type_is_pointer((CompilerMSL *)arg,var_type);
        pSVar4 = var_type;
        if (bVar1) {
          uVar2 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
          (**(code **)(*(long *)arg + 0x98))(local_200,arg,pSVar4,uVar2);
          ::std::__cxx11::string::operator=((string *)this,local_200);
          ::std::__cxx11::string::~string(local_200);
          if (*(char *)&(_Stack_50._M_nxt)->_M_nxt != '\0') {
            join<char_const(&)[2],char_const*&>
                      (local_220,(char (*) [2])0x5b521c,(char **)&stack0xffffffffffffffb0);
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_220);
            ::std::__cxx11::string::~string((string *)local_220);
          }
        }
        else {
          uVar2 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
          (**(code **)(*(long *)arg + 0x98))(local_260,arg,pSVar4,uVar2);
          join<char_const*&,std::__cxx11::string>
                    (local_240,(char **)&stack0xffffffffffffffb0,local_260);
          ::std::__cxx11::string::operator=((string *)this,(string *)local_240);
          ::std::__cxx11::string::~string((string *)local_240);
          ::std::__cxx11::string::~string((string *)local_260);
        }
      }
      else {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_type->image);
        pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar2);
        (**(code **)(*(long *)arg + 0x98))(local_1e0,arg,pSVar4,0);
        join<char_const*&,char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                  (local_1c0,(char **)&stack0xffffffffffffffb0,
                   (char (*) [24])"spvDynamicImageSampler<",local_1e0,(char (*) [2])0x5baa5d);
        ::std::__cxx11::string::operator=((string *)this,(string *)local_1c0);
        ::std::__cxx11::string::~string((string *)local_1c0);
        ::std::__cxx11::string::~string((string *)local_1e0);
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
        Compiler::set_extended_decoration
                  ((Compiler *)arg,uVar2,SPIRVCrossDecorationDynamicImageSampler,0);
      }
    }
    else {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).field_0xc);
      pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar2);
      local_dc = pSVar4->storage;
      if ((local_dc == StorageClassInput) &&
         ((local_94 == BuiltInTessLevelInner || (local_94 == BuiltInTessLevelOuter)))) {
        *(undefined1 *)((long)&arg[0x229].id.id + 2) = 0;
      }
      else if ((local_94 != BuiltInClipDistance) && (local_94 != BuiltInCullDistance)) {
        *(undefined1 *)((long)&arg[0x229].id.id + 2) = 1;
      }
      if (((local_dc == StorageClassOutput) &&
          (bVar1 = variable_storage_requires_stage_io((CompilerMSL *)arg,StorageClassOutput), bVar1)
          ) && (bVar1 = CompilerGLSL::is_stage_output_builtin_masked((CompilerGLSL *)arg,local_94),
               !bVar1)) {
        *(undefined1 *)((long)&arg[0x229].id.id + 2) = 1;
      }
      pSVar4 = var_type;
      id = local_94;
      if ((arg[0x229].id.id & 0x10000) == 0) {
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
        (**(code **)(*(long *)arg + 0x98))(local_160,arg,pSVar4,uVar2);
        join<char_const*&,std::__cxx11::string>
                  (local_140,(char **)&stack0xffffffffffffffb0,local_160);
        ::std::__cxx11::string::operator=((string *)this,(string *)local_140);
        ::std::__cxx11::string::~string((string *)local_140);
        ::std::__cxx11::string::~string((string *)local_160);
      }
      else {
        TypedID::operator_cast_to_unsigned_int
                  ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
        builtin_type_decl_abi_cxx11_((CompilerMSL *)local_120,builtin_00,id);
        join<char_const*&,std::__cxx11::string>
                  ((spirv_cross *)(local_120 + 0x20),(char **)&stack0xffffffffffffffb0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
        ::std::__cxx11::string::operator=((string *)this,(string *)(local_120 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_120 + 0x20));
        ::std::__cxx11::string::~string((string *)local_120);
      }
    }
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->field_0x1c);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&arg[0x227].alias_global_variable);
    if (uVar2 != uVar3) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->field_0x1c);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)(arg + 0x228));
      if (uVar2 != uVar3) goto LAB_004a247b;
    }
    pSVar4 = var_type;
    uVar2 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
    (**(code **)(*(long *)arg + 0x98))(local_d8,arg,pSVar4,uVar2);
    join<char_const*&,std::__cxx11::string>(local_b8,(char **)&stack0xffffffffffffffb0,local_d8);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_b8);
    ::std::__cxx11::string::~string((string *)local_b8);
    ::std::__cxx11::string::~string((string *)local_d8);
  }
  if ((((builtin_type._3_1_ & 1) == BuiltInPosition >> 0x18) && ((constref & 1U) == 0)) &&
     ((name_id == 7 || (name_id == 8)))) {
    if (((arg[0x1f5].field_0x13 & 1) == 0) ||
       (bVar1 = Compiler::is_array((Compiler *)arg,var_type), !bVar1)) {
      uVar6 = ::std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  ((spirv_cross *)(local_330 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   (char (*) [2])0x5b521c,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        ::std::__cxx11::string::operator=((string *)this,(string *)(local_330 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_330 + 0x20));
      }
      ::std::__cxx11::string::operator+=((string *)this," ");
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_330,builtin_00,SUB41(cv_qualifier._4_4_,0));
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_330);
      ::std::__cxx11::string::~string((string *)local_330);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_2a0,"thread const ",(allocator *)((long)&restrict_kw + 7));
      ::std::operator+(local_280,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2a0);
      ::std::__cxx11::string::operator=((string *)this,(string *)local_280);
      ::std::__cxx11::string::~string((string *)local_280);
      ::std::__cxx11::string::~string(local_2a0);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&restrict_kw + 7));
      ::std::__cxx11::string::operator+=((string *)this," (&");
      local_2d0._32_8_ = to_restrict((CompilerMSL *)arg,cv_qualifier._4_4_,true);
      if ((char)((TypedID<(spirv_cross::Types)0> *)local_2d0._32_8_)->id != '\0') {
        ::std::__cxx11::string::operator+=((string *)this," ");
        ::std::__cxx11::string::operator+=((string *)this,(char *)local_2d0._32_8_);
      }
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_2d0,builtin_00,SUB41(cv_qualifier._4_4_,0));
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_2d0);
      ::std::__cxx11::string::~string((string *)local_2d0);
      ::std::__cxx11::string::operator+=((string *)this,")");
      (**(code **)(*(long *)arg + 0x128))(local_2f0,arg,var_type);
      ::std::__cxx11::string::operator+=((string *)this,local_2f0);
      ::std::__cxx11::string::~string(local_2f0);
    }
  }
  else {
    bVar1 = Compiler::is_array((Compiler *)arg,var_type);
    if ((bVar1) && ((cv_qualifier._2_1_ & 1) == 0)) {
      uVar6 = ::std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  ((spirv_cross *)&argument_buffer_space,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   (char (*) [2])0x5b521c,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        ::std::__cxx11::string::operator=((string *)this,(string *)&argument_buffer_space);
        ::std::__cxx11::string::~string((string *)&argument_buffer_space);
      }
      register0x00000000 =
           (Variant *)
           descriptor_address_space((CompilerMSL *)arg,cv_qualifier._4_4_,name_id,(char *)0x0);
      if (register0x00000000 != (Variant *)0x0) {
        ::std::__cxx11::string::operator+=((string *)this," ");
        ::std::__cxx11::string::operator+=((string *)this,(char *)stack0xfffffffffffffca8);
      }
      bVar1 = is_tesc_shader((CompilerMSL *)arg);
      if (((bVar1) && ((builtin_type._3_1_ & 1) != BuiltInPosition >> 0x18)) &&
         ((local_94 == BuiltInTessLevelInner || (local_94 == BuiltInTessLevelOuter)))) {
        local_380._36_4_ = get_physical_tess_level_array_size((CompilerMSL *)arg,local_94);
        if (local_380._36_4_ == 1) {
          ::std::__cxx11::string::operator+=((string *)this," &");
          CompilerGLSL::to_expression_abi_cxx11_
                    ((CompilerGLSL *)local_380,builtin_00,SUB41(cv_qualifier._4_4_,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_380);
          ::std::__cxx11::string::~string((string *)local_380);
        }
        else {
          ::std::__cxx11::string::operator+=((string *)this," (&");
          CompilerGLSL::to_expression_abi_cxx11_
                    ((CompilerGLSL *)local_3a0,builtin_00,SUB41(cv_qualifier._4_4_,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_3a0);
          ::std::__cxx11::string::~string((string *)local_3a0);
          ::std::__cxx11::string::operator+=((string *)this,")");
          join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    (local_3c0,(char (*) [2])0x5b2ad8,(uint *)(local_380 + 0x24),
                     (char (*) [2])0x5ab046);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_3c0);
          ::std::__cxx11::string::~string((string *)local_3c0);
        }
      }
      else {
        (**(code **)(*(long *)arg + 0x128))(&restrict_kw_1,arg,var_type);
        uVar6 = ::std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          ::std::__cxx11::string::operator+=((string *)this," (&");
        }
        else {
          ::std::__cxx11::string::operator+=((string *)this,"& ");
        }
        local_408._32_8_ = to_restrict((CompilerMSL *)arg,cv_qualifier._4_4_,true);
        if (*(char *)&((__node_base_ptr)local_408._32_8_)->_M_nxt != '\0') {
          ::std::__cxx11::string::operator+=((string *)this," ");
          ::std::__cxx11::string::operator+=((string *)this,(char *)local_408._32_8_);
        }
        CompilerGLSL::to_expression_abi_cxx11_
                  ((CompilerGLSL *)local_408,builtin_00,SUB41(cv_qualifier._4_4_,0));
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_408);
        ::std::__cxx11::string::~string((string *)local_408);
        uVar6 = ::std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          ::std::__cxx11::string::operator+=((string *)this,")");
          ::std::__cxx11::string::operator+=((string *)this,(string *)&restrict_kw_1);
        }
        ::std::__cxx11::string::~string((string *)&restrict_kw_1);
      }
    }
    else {
      bVar1 = false;
      if ((cv_qualifier._2_1_ & 1) == 0) {
        local_40c = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->field_0x1c);
        sVar8 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&arg[600].alias_global_variable,&local_40c);
        bVar1 = true;
        if (sVar8 != 0) {
          bVar1 = *(int *)&(var_type->super_IVariant).field_0xc == 0xf;
        }
      }
      if (bVar1) {
        uVar6 = ::std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          bVar1 = type_is_pointer((CompilerMSL *)arg,var_type);
          if (bVar1) {
            if (*(char *)&(_Stack_50._M_nxt)->_M_nxt == '\0') {
              ::std::__cxx11::string::operator+=((string *)this,' ');
            }
            join<std::__cxx11::string&,char_const(&)[2]>
                      (local_430,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                       ,(char (*) [2])0x5b521c);
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_430);
            ::std::__cxx11::string::~string((string *)local_430);
          }
          else {
            join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                      ((spirv_cross *)(local_470 + 0x20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                       ,(char (*) [2])0x5b521c,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
            ::std::__cxx11::string::operator=((string *)this,(string *)(local_470 + 0x20));
            ::std::__cxx11::string::~string((string *)(local_470 + 0x20));
          }
        }
        ::std::__cxx11::string::operator+=((string *)this,"&");
        ::std::__cxx11::string::operator+=((string *)this," ");
        pcVar7 = to_restrict((CompilerMSL *)arg,cv_qualifier._4_4_,true);
        ::std::__cxx11::string::operator+=((string *)this,pcVar7);
        CompilerGLSL::to_expression_abi_cxx11_
                  ((CompilerGLSL *)local_470,builtin_00,SUB41(cv_qualifier._4_4_,0));
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_470);
        ::std::__cxx11::string::~string((string *)local_470);
      }
      else if ((cv_qualifier._2_1_ & 1) == 0) {
        uVar6 = ::std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                    (local_4f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     (char (*) [2])0x5b521c,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
          ::std::__cxx11::string::operator=((string *)this,(string *)local_4f8);
          ::std::__cxx11::string::~string((string *)local_4f8);
        }
        ::std::__cxx11::string::operator+=((string *)this," ");
        CompilerGLSL::to_expression_abi_cxx11_
                  ((CompilerGLSL *)&backing_var,builtin_00,SUB41(cv_qualifier._4_4_,0));
        ::std::__cxx11::string::operator+=((string *)this,(string *)&backing_var);
        ::std::__cxx11::string::~string((string *)&backing_var);
      }
      else {
        bVar1 = VectorView<unsigned_int>::empty(&(var_type->array).super_VectorView<unsigned_int>);
        if (bVar1) {
          ::std::__cxx11::string::operator+=((string *)this," ");
          CompilerGLSL::to_expression_abi_cxx11_
                    ((CompilerGLSL *)&img_address_space,builtin_00,SUB41(cv_qualifier._4_4_,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)&img_address_space);
          ::std::__cxx11::string::~string((string *)&img_address_space);
        }
        else {
          local_498 = (__node_base_ptr)
                      descriptor_address_space
                                ((CompilerMSL *)arg,cv_qualifier._4_4_,name_id,"thread const");
          join<char_const*&,char_const(&)[2],std::__cxx11::string&>
                    ((spirv_cross *)(local_4d8 + 0x20),(char **)&local_498,(char (*) [2])0x5b521c,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
          ::std::__cxx11::string::operator=((string *)this,(string *)(local_4d8 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_4d8 + 0x20));
          ::std::__cxx11::string::operator+=((string *)this,"& ");
          CompilerGLSL::to_expression_abi_cxx11_
                    ((CompilerGLSL *)local_4d8,builtin_00,SUB41(cv_qualifier._4_4_,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_4d8);
          ::std::__cxx11::string::~string((string *)local_4d8);
        }
      }
    }
  }
  local_520 = Compiler::maybe_get_backing_variable((Compiler *)arg,cv_qualifier._4_4_);
  bVar1 = false;
  if (local_520 != (SPIRVariable *)0x0) {
    local_524 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_520->super_IVariant).self)
    ;
    sVar8 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)(arg + 0x256),&local_524);
    bVar1 = sVar8 != 0;
  }
  if (bVar1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_38->image);
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar2);
    (**(code **)(*(long *)arg + 0x98))(local_568,arg,pSVar4,0);
    ::std::operator+((char *)local_548,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ", device atomic_");
    ::std::__cxx11::string::operator+=((string *)this,local_548);
    ::std::__cxx11::string::~string(local_548);
    ::std::__cxx11::string::~string(local_568);
    CompilerGLSL::to_expression_abi_cxx11_
              ((CompilerGLSL *)local_5c8,builtin_00,SUB41(cv_qualifier._4_4_,0));
    ::std::operator+(local_5c8 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5cb7d9);
    ::std::operator+(local_588,local_5c8 + 0x20);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_588);
    ::std::__cxx11::string::~string((string *)local_588);
    ::std::__cxx11::string::~string((string *)(local_5c8 + 0x20));
    ::std::__cxx11::string::~string((string *)local_5c8);
  }
  *(undefined1 *)((long)&arg[0x229].id.id + 2) = 0;
  local_51 = 1;
  ::std::__cxx11::string::~string((string *)local_88);
  if ((local_51 & 1) == 0) {
    ::std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

string CompilerMSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	auto &var = get<SPIRVariable>(arg.id);
	auto &type = get_variable_data_type(var);
	auto &var_type = get<SPIRType>(arg.type);
	StorageClass type_storage = var_type.storage;
	bool is_pointer = var_type.pointer;

	// If we need to modify the name of the variable, make sure we use the original variable.
	// Our alias is just a shadow variable.
	uint32_t name_id = var.self;
	if (arg.alias_global_variable && var.basevariable)
		name_id = var.basevariable;

	bool constref = !arg.alias_global_variable && is_pointer && arg.write_count == 0;
	// Framebuffer fetch is plain value, const looks out of place, but it is not wrong.
	if (type_is_msl_framebuffer_fetch(type))
		constref = false;
	else if (type_storage == StorageClassUniformConstant)
		constref = true;

	bool type_is_image = type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
	                     type.basetype == SPIRType::Sampler;

	// For opaque types we handle const later due to descriptor address spaces.
	const char *cv_qualifier = (constref && !type_is_image) ? "const " : "";
	string decl;

	// If this is a combined image-sampler for a 2D image with floating-point type,
	// we emitted the 'spvDynamicImageSampler' type, and this is *not* an alias parameter
	// for a global, then we need to emit a "dynamic" combined image-sampler.
	// Unfortunately, this is necessary to properly support passing around
	// combined image-samplers with Y'CbCr conversions on them.
	bool is_dynamic_img_sampler = !arg.alias_global_variable && type.basetype == SPIRType::SampledImage &&
	                              type.image.dim == Dim2D && type_is_floating_point(get<SPIRType>(type.image.type)) &&
	                              spv_function_implementations.count(SPVFuncImplDynamicImageSampler);

	// Allow Metal to use the array<T> template to make arrays a value type
	string address_space = get_argument_address_space(var);
	bool builtin = has_decoration(var.self, DecorationBuiltIn);
	auto builtin_type = BuiltIn(get_decoration(arg.id, DecorationBuiltIn));

	if (address_space == "threadgroup")
		is_using_builtin_array = true;

	if (var.basevariable && (var.basevariable == stage_in_ptr_var_id || var.basevariable == stage_out_ptr_var_id))
		decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	else if (builtin)
	{
		// Only use templated array for Clip/Cull distance when feasible.
		// In other scenarios, we need need to override array length for tess levels (if used as outputs),
		// or we need to emit the expected type for builtins (uint vs int).
		auto storage = get<SPIRType>(var.basetype).storage;

		if (storage == StorageClassInput &&
		    (builtin_type == BuiltInTessLevelInner || builtin_type == BuiltInTessLevelOuter))
		{
			is_using_builtin_array = false;
		}
		else if (builtin_type != BuiltInClipDistance && builtin_type != BuiltInCullDistance)
		{
			is_using_builtin_array = true;
		}

		if (storage == StorageClassOutput && variable_storage_requires_stage_io(storage) &&
		    !is_stage_output_builtin_masked(builtin_type))
			is_using_builtin_array = true;

		if (is_using_builtin_array)
			decl = join(cv_qualifier, builtin_type_decl(builtin_type, arg.id));
		else
			decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	}
	else if ((type_storage == StorageClassUniform || type_storage == StorageClassStorageBuffer) && is_array(type))
	{
		is_using_builtin_array = true;
		decl += join(cv_qualifier, type_to_glsl(type, arg.id), "*");
	}
	else if (is_dynamic_img_sampler)
	{
		decl = join(cv_qualifier, "spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">");
		// Mark the variable so that we can handle passing it to another function.
		set_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	}
	else
	{
		// The type is a pointer type we need to emit cv_qualifier late.
		if (type_is_pointer(type))
		{
			decl = type_to_glsl(type, arg.id);
			if (*cv_qualifier != '\0')
				decl += join(" ", cv_qualifier);
		}
		else
			decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	}

	if (!builtin && !is_pointer &&
	    (type_storage == StorageClassFunction || type_storage == StorageClassGeneric))
	{
		// If the argument is a pure value and not an opaque type, we will pass by value.
		if (msl_options.force_native_arrays && is_array(type))
		{
			// We are receiving an array by value. This is problematic.
			// We cannot be sure of the target address space since we are supposed to receive a copy,
			// but this is not possible with MSL without some extra work.
			// We will have to assume we're getting a reference in thread address space.
			// If we happen to get a reference in constant address space, the caller must emit a copy and pass that.
			// Thread const therefore becomes the only logical choice, since we cannot "create" a constant array from
			// non-constant arrays, but we can create thread const from constant.
			decl = string("thread const ") + decl;
			decl += " (&";
			const char *restrict_kw = to_restrict(name_id, true);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);
			decl += ")";
			decl += type_to_array_glsl(type);
		}
		else
		{
			if (!address_space.empty())
				decl = join(address_space, " ", decl);
			decl += " ";
			decl += to_expression(name_id);
		}
	}
	else if (is_array(type) && !type_is_image)
	{
		// Arrays of opaque types are special cased.
		if (!address_space.empty())
			decl = join(address_space, " ", decl);

		const char *argument_buffer_space = descriptor_address_space(name_id, type_storage, nullptr);
		if (argument_buffer_space)
		{
			decl += " ";
			decl += argument_buffer_space;
		}

		// Special case, need to override the array size here if we're using tess level as an argument.
		if (is_tesc_shader() && builtin &&
		    (builtin_type == BuiltInTessLevelInner || builtin_type == BuiltInTessLevelOuter))
		{
			uint32_t array_size = get_physical_tess_level_array_size(builtin_type);
			if (array_size == 1)
			{
				decl += " &";
				decl += to_expression(name_id);
			}
			else
			{
				decl += " (&";
				decl += to_expression(name_id);
				decl += ")";
				decl += join("[", array_size, "]");
			}
		}
		else
		{
			auto array_size_decl = type_to_array_glsl(type);
			if (array_size_decl.empty())
				decl += "& ";
			else
				decl += " (&";

			const char *restrict_kw = to_restrict(name_id, true);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);

			if (!array_size_decl.empty())
			{
				decl += ")";
				decl += array_size_decl;
			}
		}
	}
	else if (!type_is_image && (!pull_model_inputs.count(var.basevariable) || type.basetype == SPIRType::Struct))
	{
		// If this is going to be a reference to a variable pointer, the address space
		// for the reference has to go before the '&', but after the '*'.
		if (!address_space.empty())
		{
			if (type_is_pointer(type))
			{
				if (*cv_qualifier == '\0')
					decl += ' ';
				decl += join(address_space, " ");
			}
			else
				decl = join(address_space, " ", decl);
		}
		decl += "&";
		decl += " ";
		decl += to_restrict(name_id, true);
		decl += to_expression(name_id);
	}
	else if (type_is_image)
	{
		if (type.array.empty())
		{
			// For non-arrayed types we can just pass opaque descriptors by value.
			// This fixes problems if descriptors are passed by value from argument buffers and plain descriptors
			// in same shader.
			// There is no address space we can actually use, but value will work.
			// This will break if applications attempt to pass down descriptor arrays as arguments, but
			// fortunately that is extremely unlikely ...
			decl += " ";
			decl += to_expression(name_id);
		}
		else
		{
			const char *img_address_space = descriptor_address_space(name_id, type_storage, "thread const");
			decl = join(img_address_space, " ", decl);
			decl += "& ";
			decl += to_expression(name_id);
		}
	}
	else
	{
		if (!address_space.empty())
			decl = join(address_space, " ", decl);
		decl += " ";
		decl += to_expression(name_id);
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(name_id);
	if (backing_var && atomic_image_vars.count(backing_var->self))
	{
		decl += ", device atomic_" + type_to_glsl(get<SPIRType>(var_type.image.type), 0);
		decl += "* " + to_expression(name_id) + "_atomic";
	}

	is_using_builtin_array = false;

	return decl;
}